

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu_basic_operations.c
# Opt level: O2

void base_add(cpu_registers *registers,uint8_t operand)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  undefined7 in_register_00000031;
  
  bVar1 = registers->A;
  iVar3 = (registers->flags & 1) + (uint)bVar1 + (int)CONCAT71(in_register_00000031,operand);
  bVar2 = (byte)iVar3;
  registers->A = bVar2;
  registers->flags =
       bVar2 & 0x80 | (bVar2 == 0) * '\x02' |
       (byte)((uint)iVar3 >> 8) & 1 |
       (byte)((operand ^ bVar2) & (bVar1 ^ bVar2)) >> 1 & 0x40 | registers->flags & 0x3c;
  return;
}

Assistant:

void base_add(cpu_registers* registers, uint8_t operand) {
    const uint16_t result_carry_bit_position = 0x100;
    bool carry_bit = get_cpu_flag(registers, CARRY_FLAG);
    uint16_t result = registers->A + operand + (uint8_t)carry_bit;

    if( (registers->A ^ result) & (operand ^ result) & 0x80 ) set_cpu_flag(registers, OVERFLOW_FLAG);
    else clear_cpu_flag(registers, OVERFLOW_FLAG);
    if(result & result_carry_bit_position) set_cpu_flag(registers, CARRY_FLAG);
    else clear_cpu_flag(registers, CARRY_FLAG);

    registers->A = result & BYTE_MASK;
    determine_zero_flag(registers, registers->A);
    determine_negative_flag(registers, registers->A);
}